

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O2

void __thiscall
btConeTwistConstraint::solveConstraintObsolete
          (btConeTwistConstraint *this,btSolverBody *bodyA,btSolverBody *bodyB,btScalar timeStep)

{
  btVector3 *pbVar1;
  float fVar2;
  btRigidBody *pbVar3;
  btTransform *angularComponent;
  btTransform *linearComponent;
  long lVar4;
  uint uVar5;
  btScalar bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  btScalar bVar10;
  undefined8 uVar11;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float in_XMM5_Da;
  float fVar12;
  btVector3 bVar13;
  btVector3 bVar14;
  btVector3 dOmegaB;
  btVector3 pivotBInW;
  btVector3 pivotAInW;
  btVector3 impulseAxis;
  btVector3 dOmegaA;
  btScalar impulseMag;
  btTransform trACur;
  btTransform trBCur;
  btVector3 avgAxis;
  btVector3 omegaB;
  btVector3 omegaA;
  btVector3 ftorqueAxis1;
  btTransform trADes;
  btTransform trAPred;
  btVector3 omegaADes;
  btTransform trBDes;
  btTransform trABDes;
  btTransform trBPred;
  btVector3 omegaBDes;
  float local_3e8;
  float fStack_3e0;
  float fStack_3dc;
  float local_3c8;
  float fStack_3c4;
  btVector3 local_3b8;
  btVector3 local_3a8;
  btVector3 local_398;
  btVector3 local_388;
  undefined8 local_378;
  undefined8 local_368;
  undefined1 local_358 [16];
  btVector3 local_340;
  btVector3 local_330;
  btScalar local_31c;
  undefined1 local_318 [56];
  float fStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  btTransform local_2a8;
  undefined1 local_268 [16];
  btTransform local_258;
  btTransform local_218;
  btTransform local_1d8;
  btTransform local_198;
  btTransform local_158;
  btTransform local_118;
  btTransform local_d8;
  btTransform local_98;
  btVector3 local_58;
  btVector3 local_40;
  
  if (this->m_useSolveConstraintObsolete != true) {
    return;
  }
  local_388 = btTransform::operator()
                        (&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                          m_worldTransform,&(this->m_rbAFrame).m_origin);
  local_398 = btTransform::operator()
                        (&(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                          m_worldTransform,&(this->m_rbBFrame).m_origin);
  fStack_3e0 = in_XMM1_Dc;
  fStack_3dc = in_XMM1_Dd;
  if (this->m_angularOnly == false) {
    join_0x00001240_0x00001200_ =
         operator-(&local_388,
                   &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                    m_worldTransform.m_origin);
    local_2a8.m_basis.m_el[0] =
         operator-(&local_398,
                   &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                    m_worldTransform.m_origin);
    btSolverBody::internalGetVelocityInLocalPointObsolete
              (bodyA,(btVector3 *)(local_318 + 0x30),(btVector3 *)&local_198);
    btSolverBody::internalGetVelocityInLocalPointObsolete
              (bodyB,(btVector3 *)&local_2a8,(btVector3 *)&local_98);
    fStack_3e0 = 0.0;
    fStack_3dc = 0.0;
    fVar7 = local_198.m_basis.m_el[0].m_floats[0] - local_98.m_basis.m_el[0].m_floats[0];
    local_358._0_4_ = local_198.m_basis.m_el[0].m_floats[1] - local_98.m_basis.m_el[0].m_floats[1];
    local_368 = CONCAT44(local_368._4_4_,
                         local_198.m_basis.m_el[0].m_floats[2] -
                         local_98.m_basis.m_el[0].m_floats[2]);
    local_378 = this->m_jac;
    for (lVar4 = 0; lVar4 != 0xfc; lVar4 = lVar4 + 0x54) {
      pbVar1 = (btVector3 *)((long)(local_378->m_linearJointAxis).m_floats + lVar4);
      fVar9 = 1.0 / *(float *)((long)(&this->m_jac[0].m_1MinvJt + 1) + lVar4);
      fVar8 = *(float *)((long)this->m_jac[0].m_linearJointAxis.m_floats + lVar4);
      fVar12 = *(float *)((long)this->m_jac[0].m_linearJointAxis.m_floats + lVar4 + 4);
      fStack_3e0 = 0.0;
      fStack_3dc = 0.0;
      fVar2 = *(float *)((long)this->m_jac[0].m_linearJointAxis.m_floats + lVar4 + 8);
      in_XMM5_Da = (local_388.m_floats[1] - local_398.m_floats[1]) * fVar12;
      fVar8 = ((((local_388.m_floats[2] - local_398.m_floats[2]) * fVar2 +
                (local_388.m_floats[0] - local_398.m_floats[0]) * fVar8 + in_XMM5_Da) * -0.3) /
              timeStep) * fVar9 -
              (fVar2 * (float)local_368 + fVar8 * fVar7 + (float)local_358._0_4_ * fVar12) * fVar9;
      (this->super_btTypedConstraint).m_appliedImpulse =
           (this->super_btTypedConstraint).m_appliedImpulse + fVar8;
      local_218.m_basis.m_el[0] = btVector3::cross((btVector3 *)(local_318 + 0x30),pbVar1);
      local_d8.m_basis.m_el[0] = btVector3::cross((btVector3 *)&local_2a8,pbVar1);
      local_158.m_basis.m_el[0].m_floats[0] = ((this->super_btTypedConstraint).m_rbA)->m_inverseMass
      ;
      local_1d8.m_basis.m_el[0] = operator*(pbVar1,(btScalar *)&local_158);
      local_118.m_basis.m_el[0] =
           operator*((btMatrix3x3 *)
                     &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).field_0x14c
                     ,(btVector3 *)&local_218);
      btSolverBody::internalApplyImpulse
                (bodyA,(btVector3 *)&local_1d8,(btVector3 *)&local_118,fVar8);
      local_158.m_basis.m_el[0].m_floats[0] = ((this->super_btTypedConstraint).m_rbB)->m_inverseMass
      ;
      local_1d8.m_basis.m_el[0] = operator*(pbVar1,(btScalar *)&local_158);
      local_118.m_basis.m_el[0] =
           operator*((btMatrix3x3 *)
                     &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).field_0x14c
                     ,(btVector3 *)&local_d8);
      btSolverBody::internalApplyImpulse
                (bodyB,(btVector3 *)&local_1d8,(btVector3 *)&local_118,-fVar8);
    }
  }
  if (this->m_bMotorEnabled == true) {
    pbVar3 = (this->super_btTypedConstraint).m_rbA;
    unique0x1000158f = *&(pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
    ;
    local_2d8 = *(undefined8 *)
                 (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats;
    uStack_2d0 = *(undefined8 *)
                  ((pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2);
    local_2c8 = *(undefined8 *)
                 (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats;
    uStack_2c0 = *(undefined8 *)
                  ((pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2);
    local_2b8 = *(undefined8 *)(pbVar3->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
    uStack_2b0 = *(undefined8 *)
                  ((pbVar3->super_btCollisionObject).m_worldTransform.m_origin.m_floats + 2);
    pbVar3 = (this->super_btTypedConstraint).m_rbB;
    local_2a8.m_basis.m_el[0].m_floats =
         *&(pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats;
    local_2a8.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats;
    local_2a8.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2);
    local_2a8.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats;
    local_2a8.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2);
    local_2a8.m_origin.m_floats._0_8_ =
         *(undefined8 *)(pbVar3->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
    local_2a8.m_origin.m_floats._8_8_ =
         *(undefined8 *)((pbVar3->super_btCollisionObject).m_worldTransform.m_origin.m_floats + 2);
    local_258.m_origin = operator+(&bodyA->m_angularVelocity,&bodyA->m_deltaAngularVelocity);
    local_258.m_basis.m_el[2] = operator+(&bodyB->m_angularVelocity,&bodyB->m_deltaAngularVelocity);
    local_198.m_basis.m_el[0].m_floats[0] = 1.0;
    local_198.m_basis.m_el[0].m_floats[1] = 0.0;
    local_198.m_basis.m_el[0].m_floats[2] = 0.0;
    local_198.m_basis.m_el[0].m_floats[3] = 0.0;
    local_198.m_basis.m_el[1].m_floats[0] = 0.0;
    local_198.m_basis.m_el[1].m_floats[1] = 1.0;
    local_198.m_basis.m_el[1].m_floats[2] = 0.0;
    local_198.m_basis.m_el[1].m_floats[3] = 0.0;
    local_198.m_basis.m_el[2].m_floats[0] = 0.0;
    local_198.m_basis.m_el[2].m_floats[1] = 0.0;
    local_198.m_basis.m_el[2].m_floats[2] = 1.0;
    local_198.m_origin.m_floats[3] = 0.0;
    local_198.m_basis.m_el[2].m_floats[3] = 0.0;
    local_198.m_origin.m_floats[0] = 0.0;
    local_198.m_origin.m_floats[1] = 0.0;
    local_198.m_origin.m_floats[2] = 0.0;
    local_58.m_floats[0] = 0.0;
    local_58.m_floats[1] = 0.0;
    local_58.m_floats[2] = 0.0;
    local_58.m_floats[3] = 0.0;
    btTransformUtil::integrateTransform
              ((btTransform *)(local_318 + 0x30),&local_58,&local_258.m_origin,timeStep,&local_198);
    local_98.m_basis.m_el[0].m_floats[0] = 1.0;
    local_98.m_basis.m_el[0].m_floats[1] = 0.0;
    local_98.m_basis.m_el[0].m_floats[2] = 0.0;
    local_98.m_basis.m_el[0].m_floats[3] = 0.0;
    local_98.m_basis.m_el[1].m_floats[0] = 0.0;
    local_98.m_basis.m_el[1].m_floats[1] = 1.0;
    local_98.m_basis.m_el[1].m_floats[2] = 0.0;
    local_98.m_basis.m_el[1].m_floats[3] = 0.0;
    local_98.m_basis.m_el[2].m_floats[0] = 0.0;
    local_98.m_basis.m_el[2].m_floats[1] = 0.0;
    local_98.m_basis.m_el[2].m_floats[2] = 1.0;
    local_98.m_basis.m_el[2].m_floats[3] = 0.0;
    local_98.m_origin.m_floats[0] = 0.0;
    local_98.m_origin.m_floats[1] = 0.0;
    local_98.m_origin.m_floats[2] = 0.0;
    local_98.m_origin.m_floats[3] = 0.0;
    btTransformUtil::integrateTransform
              (&local_2a8,&local_58,local_258.m_basis.m_el + 2,timeStep,&local_98);
    btMatrix3x3::setRotation(&local_218.m_basis,&this->m_qTarget);
    local_218.m_origin.m_floats[0] = 0.0;
    local_218.m_origin.m_floats[1] = 0.0;
    local_218.m_origin.m_floats[2] = 0.0;
    local_218.m_origin.m_floats[3] = 0.0;
    btTransform::operator*(&local_1d8,&this->m_rbBFrame,&local_218);
    btTransform::inverse(&local_118,&this->m_rbAFrame);
    btTransform::operator*(&local_d8,&local_1d8,&local_118);
    btTransform::operator*(&local_1d8,&local_98,&local_d8);
    btTransform::inverse(&local_158,&local_d8);
    btTransform::operator*(&local_118,&local_198,&local_158);
    btTransformUtil::calculateVelocity
              ((btTransform *)(local_318 + 0x30),&local_1d8,timeStep,&local_58,
               (btVector3 *)&local_158);
    btTransformUtil::calculateVelocity(&local_2a8,&local_118,timeStep,&local_58,&local_40);
    local_330.m_floats[0] = local_158.m_basis.m_el[0].m_floats[0] - local_258.m_origin.m_floats[0];
    local_330.m_floats[1] = local_158.m_basis.m_el[0].m_floats[1] - local_258.m_origin.m_floats[1];
    local_330.m_floats[2] = local_158.m_basis.m_el[0].m_floats[2] - local_258.m_origin.m_floats[2];
    local_330.m_floats[3] = 0.0;
    local_3a8.m_floats[0] = local_40.m_floats[0] - local_258.m_basis.m_el[2].m_floats[0];
    local_3a8.m_floats[1] = local_40.m_floats[1] - local_258.m_basis.m_el[2].m_floats[1];
    local_3a8.m_floats[2] = local_40.m_floats[2] - local_258.m_basis.m_el[2].m_floats[2];
    local_3a8.m_floats[3] = 0.0;
    bVar6 = btVector3::length2(&local_330);
    fVar7 = 0.0;
    if (1.1920929e-07 < bVar6) {
      local_318._32_16_ = (undefined1  [16])btVector3::normalized(&local_330);
      fVar7 = btRigidBody::computeAngularImpulseDenominator
                        ((this->super_btTypedConstraint).m_rbA,(btVector3 *)(local_318 + 0x20));
    }
    bVar6 = btVector3::length2(&local_3a8);
    fVar8 = 0.0;
    if (1.1920929e-07 < bVar6) {
      local_318._16_16_ = (undefined1  [16])btVector3::normalized(&local_3a8);
      fVar8 = btRigidBody::computeAngularImpulseDenominator
                        ((this->super_btTypedConstraint).m_rbB,(btVector3 *)(local_318 + 0x10));
      in_XMM5_Da = (float)local_318._16_4_;
    }
    fStack_3e0 = 0.0;
    fStack_3dc = 0.0;
    local_258.m_basis.m_el[1].m_floats[1] =
         (float)local_318._20_4_ * fVar8 + fVar7 * local_318._36_4_;
    local_258.m_basis.m_el[1].m_floats[0] = in_XMM5_Da * fVar8 + fVar7 * local_318._32_4_;
    local_258.m_basis.m_el[1].m_floats[2] =
         (float)local_318._24_4_ * fVar8 + (float)local_318._40_4_ * fVar7;
    local_258.m_basis.m_el[1].m_floats[3] = 0.0;
    bVar6 = btVector3::length2(local_258.m_basis.m_el + 1);
    if (bVar6 <= 1.1920929e-07) goto LAB_0016d079;
    pbVar1 = local_258.m_basis.m_el + 1;
    btVector3::normalize(pbVar1);
    fVar7 = btRigidBody::computeAngularImpulseDenominator
                      ((this->super_btTypedConstraint).m_rbA,pbVar1);
    bVar6 = btRigidBody::computeAngularImpulseDenominator
                      ((this->super_btTypedConstraint).m_rbB,pbVar1);
    local_340.m_floats[1] = fVar7 * local_330.m_floats[1] - bVar6 * local_3a8.m_floats[1];
    local_340.m_floats[0] = fVar7 * local_330.m_floats[0] - bVar6 * local_3a8.m_floats[0];
    local_340.m_floats[2] = local_330.m_floats[2] * fVar7 - local_3a8.m_floats[2] * bVar6;
    local_340.m_floats[3] = 0.0;
    local_318._0_4_ = (fVar7 + bVar6) * (fVar7 + bVar6);
    local_3b8 = operator/(&local_340,(btScalar *)local_318);
    fStack_3e0 = 0.0;
    fStack_3dc = 0.0;
    if (0.0 <= this->m_maxMotorImpulse) {
      if (this->m_bNormalizedMotorStrength == false) {
        fVar7 = 1.0;
      }
      fVar7 = this->m_maxMotorImpulse / fVar7;
      pbVar1 = &this->m_accMotorImpulse;
      local_340 = operator+(pbVar1,&local_3b8);
      bVar6 = btVector3::length(&local_340);
      fStack_3e0 = 0.0;
      fStack_3dc = 0.0;
      if (fVar7 < bVar6) {
        btVector3::normalize(&local_340);
        bVar13.m_floats = local_340.m_floats;
        fVar8 = local_340.m_floats[0];
        fStack_3e0 = 0.0;
        fStack_3dc = 0.0;
        local_340.m_floats[1] = fVar7 * local_340.m_floats[1];
        local_340.m_floats[0] = fVar7 * fVar8;
        local_340.m_floats[2] = bVar13.m_floats[2];
        local_340.m_floats[3] = bVar13.m_floats[3];
        local_340.m_floats[2] = fVar7 * local_340.m_floats[2];
        local_3b8 = operator-(&local_340,pbVar1);
      }
      btVector3::operator+=(pbVar1,&local_3b8);
    }
    local_31c = btVector3::length(&local_3b8);
    local_340 = operator/(&local_3b8,&local_31c);
    local_318._0_4_ = 0.0;
    local_318._4_4_ = 0.0;
    local_318._8_4_ = 0.0;
    local_318._12_4_ = 0.0;
    local_258.m_basis.m_el[0] =
         operator*((btMatrix3x3 *)
                   &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).field_0x14c,
                   &local_340);
    btSolverBody::internalApplyImpulse
              (bodyA,(btVector3 *)local_318,(btVector3 *)&local_258,local_31c);
    local_318._0_4_ = 0.0;
    local_318._4_4_ = 0.0;
    local_318._8_4_ = 0.0;
    local_318._12_4_ = 0.0;
    local_258.m_basis.m_el[0] =
         operator*((btMatrix3x3 *)
                   &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).field_0x14c,
                   &local_340);
    linearComponent = (btTransform *)local_318;
    angularComponent = &local_258;
    bVar6 = local_31c;
  }
  else {
    if (this->m_damping <= 1.1920929e-07) goto LAB_0016d079;
    bVar13 = operator+(&bodyA->m_angularVelocity,&bodyA->m_deltaAngularVelocity);
    fVar7 = fStack_3e0;
    fVar8 = fStack_3dc;
    bVar14 = operator+(&bodyB->m_angularVelocity,&bodyB->m_deltaAngularVelocity);
    local_3c8 = bVar13.m_floats[0];
    fStack_3c4 = bVar13.m_floats[1];
    local_318._48_4_ = bVar14.m_floats[0] - local_3c8;
    local_318._52_4_ = bVar14.m_floats[1] - fStack_3c4;
    local_3e8 = bVar13.m_floats[2];
    fStack_3e0 = fVar7 - fStack_3e0;
    fStack_3dc = fVar8 - fStack_3dc;
    fStack_2e0 = bVar14.m_floats[2] - local_3e8;
    register0x0000120c = 0.0;
    bVar6 = btVector3::length2((btVector3 *)(local_318 + 0x30));
    if (bVar6 <= 1.1920929e-07) goto LAB_0016d079;
    local_2a8.m_basis.m_el[0] = btVector3::normalized((btVector3 *)(local_318 + 0x30));
    bVar6 = btRigidBody::computeAngularImpulseDenominator
                      ((this->super_btTypedConstraint).m_rbA,(btVector3 *)&local_2a8);
    bVar10 = btRigidBody::computeAngularImpulseDenominator
                       ((this->super_btTypedConstraint).m_rbB,(btVector3 *)&local_2a8);
    fStack_3e0 = 0.0;
    fStack_3dc = 0.0;
    local_198.m_basis.m_el[0].m_floats[2] = (1.0 / (bVar10 + bVar6)) * this->m_damping;
    local_198.m_basis.m_el[0].m_floats[0] = local_198.m_basis.m_el[0].m_floats[2] * local_318._48_4_
    ;
    local_198.m_basis.m_el[0].m_floats[1] = local_198.m_basis.m_el[0].m_floats[2] * local_318._52_4_
    ;
    local_198.m_basis.m_el[0].m_floats[2] = local_198.m_basis.m_el[0].m_floats[2] * fStack_2e0;
    local_198.m_basis.m_el[0].m_floats[3] = 0.0;
    bVar6 = btVector3::length((btVector3 *)&local_198);
    local_1d8.m_basis.m_el[0].m_floats[0] = bVar6;
    bVar13 = operator/((btVector3 *)&local_198,(btScalar *)&local_1d8);
    local_98.m_basis.m_el[0].m_floats[0] = bVar13.m_floats[0];
    local_98.m_basis.m_el[0].m_floats[1] = bVar13.m_floats[1];
    local_98.m_basis.m_el[0].m_floats[2] = bVar13.m_floats[2];
    local_98.m_basis.m_el[0].m_floats[3] = bVar13.m_floats[3];
    local_218.m_basis.m_el[0].m_floats = (btScalar  [4])ZEXT816(0);
    local_d8.m_basis.m_el[0] =
         operator*((btMatrix3x3 *)
                   &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).field_0x14c,
                   (btVector3 *)&local_98);
    btSolverBody::internalApplyImpulse
              (bodyA,(btVector3 *)&local_218,(btVector3 *)&local_d8,
               local_1d8.m_basis.m_el[0].m_floats[0]);
    local_218.m_basis.m_el[0].m_floats = (btScalar  [4])ZEXT816(0);
    local_d8.m_basis.m_el[0] =
         operator*((btMatrix3x3 *)
                   &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).field_0x14c,
                   (btVector3 *)&local_98);
    linearComponent = &local_218;
    angularComponent = &local_d8;
    bVar6 = local_1d8.m_basis.m_el[0].m_floats[0];
  }
  btSolverBody::internalApplyImpulse
            (bodyB,(btVector3 *)linearComponent,(btVector3 *)angularComponent,-bVar6);
LAB_0016d079:
  bVar13 = operator+(&bodyA->m_angularVelocity,&bodyA->m_deltaAngularVelocity);
  bVar14 = operator+(&bodyB->m_angularVelocity,&bodyB->m_deltaAngularVelocity);
  local_3c8 = bVar13.m_floats[0];
  fStack_3c4 = bVar13.m_floats[1];
  local_3e8 = bVar13.m_floats[2];
  fVar7 = bVar14.m_floats[2];
  uVar11 = bVar14.m_floats._0_8_;
  if (this->m_solveSwingLimit == true) {
    fVar12 = (this->m_swingCorrection * this->m_swingLimitRatio * this->m_biasFactor) / timeStep;
    fVar8 = (bVar14.m_floats[2] - local_3e8) * (this->m_swingAxis).m_floats[2] +
            (this->m_swingAxis).m_floats[0] * (bVar14.m_floats[0] - local_3c8) +
            (bVar14.m_floats[1] - fStack_3c4) * (this->m_swingAxis).m_floats[1];
    uVar5 = -(uint)(0.0 < fVar8);
    fVar7 = this->m_accSwingLimitImpulse;
    fVar8 = (float)(~uVar5 & (uint)fVar12 |
                   (uint)(this->m_swingLimitRatio * fVar8 * this->m_relaxationFactor + fVar12) &
                   uVar5) * this->m_kSwing + fVar7;
    if (fVar8 <= 0.0) {
      fVar8 = 0.0;
    }
    this->m_accSwingLimitImpulse = fVar8;
    local_358._8_4_ = fStack_3e0;
    local_358._0_8_ = bVar14.m_floats._8_8_;
    local_358._12_4_ = fStack_3dc;
    local_368 = bVar14.m_floats._0_8_;
    local_218.m_basis.m_el[0].m_floats[0] = fVar8 - fVar7;
    bVar13 = operator*(&this->m_swingAxis,(btScalar *)&local_218);
    local_378 = bVar13.m_floats._0_8_;
    local_268._8_4_ = fStack_3e0;
    local_268._0_8_ = bVar13.m_floats._8_8_;
    local_268._12_4_ = fStack_3dc;
    local_318._48_4_ =
         (this->m_twistAxisA).m_floats[2] * bVar13.m_floats[2] +
         (this->m_twistAxisA).m_floats[0] * bVar13.m_floats[0] +
         bVar13.m_floats[1] * (this->m_twistAxisA).m_floats[1];
    bVar13 = operator*(&this->m_twistAxisA,(btScalar *)(local_318 + 0x30));
    local_318._48_4_ = (float)local_378 - bVar13.m_floats[0];
    local_318._52_4_ = local_378._4_4_ - bVar13.m_floats[1];
    fStack_2e0 = (float)local_268._0_4_ - bVar13.m_floats[2];
    register0x0000128c = 0.0;
    local_218.m_basis.m_el[0].m_floats[0] = btVector3::length((btVector3 *)(local_318 + 0x30));
    local_2a8.m_basis.m_el[0] = operator/((btVector3 *)(local_318 + 0x30),(btScalar *)&local_218);
    local_198.m_basis.m_el[0].m_floats[0] = 0.0;
    local_198.m_basis.m_el[0].m_floats[1] = 0.0;
    local_198.m_basis.m_el[0].m_floats[2] = 0.0;
    local_198.m_basis.m_el[0].m_floats[3] = 0.0;
    bVar13 = operator*((btMatrix3x3 *)
                       &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                        field_0x14c,(btVector3 *)&local_2a8);
    local_98.m_basis.m_el[0].m_floats[0] = bVar13.m_floats[0];
    local_98.m_basis.m_el[0].m_floats[1] = bVar13.m_floats[1];
    local_98.m_basis.m_el[0].m_floats[2] = bVar13.m_floats[2];
    local_98.m_basis.m_el[0].m_floats[3] = bVar13.m_floats[3];
    btSolverBody::internalApplyImpulse
              (bodyA,(btVector3 *)&local_198,(btVector3 *)&local_98,
               local_218.m_basis.m_el[0].m_floats[0]);
    local_198.m_basis.m_el[0].m_floats[0] = 0.0;
    local_198.m_basis.m_el[0].m_floats[1] = 0.0;
    local_198.m_basis.m_el[0].m_floats[2] = 0.0;
    local_198.m_basis.m_el[0].m_floats[3] = 0.0;
    bVar13 = operator*((btMatrix3x3 *)
                       &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                        field_0x14c,(btVector3 *)&local_2a8);
    local_98.m_basis.m_el[0].m_floats[0] = bVar13.m_floats[0];
    local_98.m_basis.m_el[0].m_floats[1] = bVar13.m_floats[1];
    local_98.m_basis.m_el[0].m_floats[2] = bVar13.m_floats[2];
    local_98.m_basis.m_el[0].m_floats[3] = bVar13.m_floats[3];
    btSolverBody::internalApplyImpulse
              (bodyB,(btVector3 *)&local_198,(btVector3 *)&local_98,
               -local_218.m_basis.m_el[0].m_floats[0]);
    fVar7 = (float)local_358._0_4_;
    uVar11 = local_368;
  }
  if (this->m_solveTwistLimit == true) {
    fVar8 = this->m_accTwistLimitImpulse;
    fVar12 = (this->m_twistCorrection * this->m_twistLimitRatio * this->m_biasFactor) / timeStep;
    fVar7 = (fVar7 - local_3e8) * (this->m_twistAxis).m_floats[2] +
            (this->m_twistAxis).m_floats[0] * ((float)uVar11 - local_3c8) +
            ((float)((ulong)uVar11 >> 0x20) - fStack_3c4) * (this->m_twistAxis).m_floats[1];
    uVar5 = -(uint)(0.0 < fVar7);
    fVar7 = (float)(~uVar5 & (uint)fVar12 |
                   (uint)(this->m_twistLimitRatio * fVar7 * this->m_relaxationFactor + fVar12) &
                   uVar5) * this->m_kTwist + fVar8;
    if (fVar7 <= 0.0) {
      fVar7 = 0.0;
    }
    this->m_accTwistLimitImpulse = fVar7;
    fVar7 = fVar7 - fVar8;
    register0x00001200 = ZEXT812(0);
    register0x0000120c = 0.0;
    local_2a8.m_basis.m_el[0] =
         operator*((btMatrix3x3 *)
                   &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).field_0x14c,
                   &this->m_twistAxis);
    btSolverBody::internalApplyImpulse
              (bodyA,(btVector3 *)(local_318 + 0x30),(btVector3 *)&local_2a8,fVar7);
    stack0xfffffffffffffd18 = (btScalar  [4])ZEXT816(0);
    local_2a8.m_basis.m_el[0] =
         operator*((btMatrix3x3 *)
                   &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).field_0x14c,
                   &this->m_twistAxis);
    btSolverBody::internalApplyImpulse
              (bodyB,(btVector3 *)(local_318 + 0x30),(btVector3 *)&local_2a8,-fVar7);
  }
  return;
}

Assistant:

void	btConeTwistConstraint::solveConstraintObsolete(btSolverBody& bodyA,btSolverBody& bodyB,btScalar	timeStep)
{
	#ifndef __SPU__
	if (m_useSolveConstraintObsolete)
	{
		btVector3 pivotAInW = m_rbA.getCenterOfMassTransform()*m_rbAFrame.getOrigin();
		btVector3 pivotBInW = m_rbB.getCenterOfMassTransform()*m_rbBFrame.getOrigin();

		btScalar tau = btScalar(0.3);

		//linear part
		if (!m_angularOnly)
		{
			btVector3 rel_pos1 = pivotAInW - m_rbA.getCenterOfMassPosition(); 
			btVector3 rel_pos2 = pivotBInW - m_rbB.getCenterOfMassPosition();

			btVector3 vel1;
			bodyA.internalGetVelocityInLocalPointObsolete(rel_pos1,vel1);
			btVector3 vel2;
			bodyB.internalGetVelocityInLocalPointObsolete(rel_pos2,vel2);
			btVector3 vel = vel1 - vel2;

			for (int i=0;i<3;i++)
			{		
				const btVector3& normal = m_jac[i].m_linearJointAxis;
				btScalar jacDiagABInv = btScalar(1.) / m_jac[i].getDiagonal();

				btScalar rel_vel;
				rel_vel = normal.dot(vel);
				//positional error (zeroth order error)
				btScalar depth = -(pivotAInW - pivotBInW).dot(normal); //this is the error projected on the normal
				btScalar impulse = depth*tau/timeStep  * jacDiagABInv -  rel_vel * jacDiagABInv;
				m_appliedImpulse += impulse;
				
				btVector3 ftorqueAxis1 = rel_pos1.cross(normal);
				btVector3 ftorqueAxis2 = rel_pos2.cross(normal);
				bodyA.internalApplyImpulse(normal*m_rbA.getInvMass(), m_rbA.getInvInertiaTensorWorld()*ftorqueAxis1,impulse);
				bodyB.internalApplyImpulse(normal*m_rbB.getInvMass(), m_rbB.getInvInertiaTensorWorld()*ftorqueAxis2,-impulse);
		
			}
		}

		// apply motor
		if (m_bMotorEnabled)
		{
			// compute current and predicted transforms
			btTransform trACur = m_rbA.getCenterOfMassTransform();
			btTransform trBCur = m_rbB.getCenterOfMassTransform();
			btVector3 omegaA; bodyA.internalGetAngularVelocity(omegaA);
			btVector3 omegaB; bodyB.internalGetAngularVelocity(omegaB);
			btTransform trAPred; trAPred.setIdentity(); 
			btVector3 zerovec(0,0,0);
			btTransformUtil::integrateTransform(
				trACur, zerovec, omegaA, timeStep, trAPred);
			btTransform trBPred; trBPred.setIdentity(); 
			btTransformUtil::integrateTransform(
				trBCur, zerovec, omegaB, timeStep, trBPred);

			// compute desired transforms in world
			btTransform trPose(m_qTarget);
			btTransform trABDes = m_rbBFrame * trPose * m_rbAFrame.inverse();
			btTransform trADes = trBPred * trABDes;
			btTransform trBDes = trAPred * trABDes.inverse();

			// compute desired omegas in world
			btVector3 omegaADes, omegaBDes;
			
			btTransformUtil::calculateVelocity(trACur, trADes, timeStep, zerovec, omegaADes);
			btTransformUtil::calculateVelocity(trBCur, trBDes, timeStep, zerovec, omegaBDes);

			// compute delta omegas
			btVector3 dOmegaA = omegaADes - omegaA;
			btVector3 dOmegaB = omegaBDes - omegaB;

			// compute weighted avg axis of dOmega (weighting based on inertias)
			btVector3 axisA, axisB;
			btScalar kAxisAInv = 0, kAxisBInv = 0;

			if (dOmegaA.length2() > SIMD_EPSILON)
			{
				axisA = dOmegaA.normalized();
				kAxisAInv = getRigidBodyA().computeAngularImpulseDenominator(axisA);
			}

			if (dOmegaB.length2() > SIMD_EPSILON)
			{
				axisB = dOmegaB.normalized();
				kAxisBInv = getRigidBodyB().computeAngularImpulseDenominator(axisB);
			}

			btVector3 avgAxis = kAxisAInv * axisA + kAxisBInv * axisB;

			static bool bDoTorque = true;
			if (bDoTorque && avgAxis.length2() > SIMD_EPSILON)
			{
				avgAxis.normalize();
				kAxisAInv = getRigidBodyA().computeAngularImpulseDenominator(avgAxis);
				kAxisBInv = getRigidBodyB().computeAngularImpulseDenominator(avgAxis);
				btScalar kInvCombined = kAxisAInv + kAxisBInv;

				btVector3 impulse = (kAxisAInv * dOmegaA - kAxisBInv * dOmegaB) /
									(kInvCombined * kInvCombined);

				if (m_maxMotorImpulse >= 0)
				{
					btScalar fMaxImpulse = m_maxMotorImpulse;
					if (m_bNormalizedMotorStrength)
						fMaxImpulse = fMaxImpulse/kAxisAInv;

					btVector3 newUnclampedAccImpulse = m_accMotorImpulse + impulse;
					btScalar  newUnclampedMag = newUnclampedAccImpulse.length();
					if (newUnclampedMag > fMaxImpulse)
					{
						newUnclampedAccImpulse.normalize();
						newUnclampedAccImpulse *= fMaxImpulse;
						impulse = newUnclampedAccImpulse - m_accMotorImpulse;
					}
					m_accMotorImpulse += impulse;
				}

				btScalar  impulseMag  = impulse.length();
				btVector3 impulseAxis =  impulse / impulseMag;

				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*impulseAxis, impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*impulseAxis, -impulseMag);

			}
		}
		else if (m_damping > SIMD_EPSILON) // no motor: do a little damping
		{
			btVector3 angVelA; bodyA.internalGetAngularVelocity(angVelA);
			btVector3 angVelB; bodyB.internalGetAngularVelocity(angVelB);
			btVector3 relVel = angVelB - angVelA;
			if (relVel.length2() > SIMD_EPSILON)
			{
				btVector3 relVelAxis = relVel.normalized();
				btScalar m_kDamping =  btScalar(1.) /
					(getRigidBodyA().computeAngularImpulseDenominator(relVelAxis) +
					 getRigidBodyB().computeAngularImpulseDenominator(relVelAxis));
				btVector3 impulse = m_damping * m_kDamping * relVel;

				btScalar  impulseMag  = impulse.length();
				btVector3 impulseAxis = impulse / impulseMag;
				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*impulseAxis, impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*impulseAxis, -impulseMag);
			}
		}

		// joint limits
		{
			///solve angular part
			btVector3 angVelA;
			bodyA.internalGetAngularVelocity(angVelA);
			btVector3 angVelB;
			bodyB.internalGetAngularVelocity(angVelB);

			// solve swing limit
			if (m_solveSwingLimit)
			{
				btScalar amplitude = m_swingLimitRatio * m_swingCorrection*m_biasFactor/timeStep;
				btScalar relSwingVel = (angVelB - angVelA).dot(m_swingAxis);
				if (relSwingVel > 0)
					amplitude += m_swingLimitRatio * relSwingVel * m_relaxationFactor;
				btScalar impulseMag = amplitude * m_kSwing;

				// Clamp the accumulated impulse
				btScalar temp = m_accSwingLimitImpulse;
				m_accSwingLimitImpulse = btMax(m_accSwingLimitImpulse + impulseMag, btScalar(0.0) );
				impulseMag = m_accSwingLimitImpulse - temp;

				btVector3 impulse = m_swingAxis * impulseMag;

				// don't let cone response affect twist
				// (this can happen since body A's twist doesn't match body B's AND we use an elliptical cone limit)
				{
					btVector3 impulseTwistCouple = impulse.dot(m_twistAxisA) * m_twistAxisA;
					btVector3 impulseNoTwistCouple = impulse - impulseTwistCouple;
					impulse = impulseNoTwistCouple;
				}

				impulseMag = impulse.length();
				btVector3 noTwistSwingAxis = impulse / impulseMag;

				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*noTwistSwingAxis, impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*noTwistSwingAxis, -impulseMag);
			}


			// solve twist limit
			if (m_solveTwistLimit)
			{
				btScalar amplitude = m_twistLimitRatio * m_twistCorrection*m_biasFactor/timeStep;
				btScalar relTwistVel = (angVelB - angVelA).dot( m_twistAxis );
				if (relTwistVel > 0) // only damp when moving towards limit (m_twistAxis flipping is important)
					amplitude += m_twistLimitRatio * relTwistVel * m_relaxationFactor;
				btScalar impulseMag = amplitude * m_kTwist;

				// Clamp the accumulated impulse
				btScalar temp = m_accTwistLimitImpulse;
				m_accTwistLimitImpulse = btMax(m_accTwistLimitImpulse + impulseMag, btScalar(0.0) );
				impulseMag = m_accTwistLimitImpulse - temp;

		//		btVector3 impulse = m_twistAxis * impulseMag;

				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*m_twistAxis,impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*m_twistAxis,-impulseMag);
			}		
		}
	}
#else
btAssert(0);
#endif //__SPU__
}